

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::ApplicationInfoFilter::Impl::should_record_immutable_samplers
          (Impl *this,VkApplicationInfo *info)

{
  char *pcVar1;
  bool bVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
  local_90;
  allocator local_81;
  key_type local_80;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
  local_60;
  iterator itr_1;
  allocator local_49;
  key_type local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
  local_28;
  iterator itr;
  VkApplicationInfo *info_local;
  Impl *this_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
               )info;
  if ((info != (VkApplicationInfo *)0x0) && (info->pApplicationName != (char *)0x0)) {
    pcVar1 = info->pApplicationName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
         ::find(&this->application_infos,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    itr_1 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
            ::end(&this->application_infos);
    bVar2 = std::__detail::operator!=
                      (&local_28,
                       &itr_1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                      );
    if (bVar2) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                             *)&local_28);
      return (bool)((ppVar3->second).record_immutable_samplers & 1);
    }
  }
  if ((itr.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
       ._M_cur != (__node_type *)0x0) &&
     (*(long *)((long)itr.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                      ._M_cur + 0x20) != 0)) {
    pcVar1 = *(char **)((long)itr.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                              ._M_cur + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,pcVar1,&local_81);
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
         ::find(&this->engine_infos,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    local_90._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>_>
         ::end(&this->engine_infos);
    bVar2 = std::__detail::operator!=(&local_60,&local_90);
    if (bVar2) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_false,_true>
                             *)&local_60);
      return (bool)((ppVar3->second).record_immutable_samplers & 1);
    }
  }
  return true;
}

Assistant:

bool ApplicationInfoFilter::Impl::should_record_immutable_samplers(const VkApplicationInfo *info)
{
	if (info && info->pApplicationName)
	{
		auto itr = application_infos.find(info->pApplicationName);
		if (itr != application_infos.end())
			return itr->second.record_immutable_samplers;
	}

	if (info && info->pEngineName)
	{
		auto itr = engine_infos.find(info->pEngineName);
		if (itr != engine_infos.end())
			return itr->second.record_immutable_samplers;
	}

	return true;
}